

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  bool bVar1;
  double dVar2;
  float fVar3;
  int iVar4;
  GLuint GVar5;
  GLuint shader;
  GLuint program;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  uint uVar9;
  ostream *poVar10;
  uint uVar11;
  int iVar12;
  const_iterator __cbeg;
  int *piVar13;
  anon_union_16_3_e2189aaa_for_tvec4<float>_1 *m1;
  char *pcVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  float fVar19;
  int width;
  float rotation_1;
  int height;
  float rotation;
  mat4 m;
  mat4 mvp;
  GLuint vao;
  GLuint cubemap;
  int local_180;
  undefined4 local_17c;
  undefined4 local_178;
  undefined4 local_174;
  GLuint local_170;
  float local_16c;
  int local_168;
  anon_union_12_3_e2189aaa_for_tvec3<float>_1 local_164;
  undefined1 local_158 [28];
  col_type cStack_13c;
  col_type cStack_12c;
  undefined4 local_11c;
  anon_union_16_3_e2189aaa_for_tvec4<float>_1 local_118;
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined4 local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  value_type vStack_dc;
  undefined1 local_d8 [16];
  long local_c0;
  value_type local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  value_type vStack_7c;
  anon_union_16_3_e2189aaa_for_tvec4<float>_1 local_78;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 local_34;
  
  iVar4 = glfwInit();
  if (iVar4 == 0) {
    pcVar14 = "Failed to init GLFW";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"GLFW Successfully Started",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
    std::ostream::put('0');
    std::ostream::flush();
    glfwSetErrorCallback(glfw_error_callback);
    glfwWindowHint(0x22002,4);
    glfwWindowHint(0x22003,0);
    local_c0 = glfwCreateWindow(0x280,0x1e0,"Stupid SH Tricks",0,0);
    if (local_c0 != 0) {
      iVar4 = 0x110c7f;
      glfwSetKeyCallback(local_c0);
      glfwMakeContextCurrent(local_c0);
      glewInit();
      glfwSwapInterval(1);
      _check_gl_error((char *)0x1a0,iVar4);
      iVar4 = (int)&local_38;
      (*__glewGenVertexArrays)(1);
      (*__glewBindVertexArray)(local_38);
      _check_gl_error((char *)0x1a5,iVar4);
      (*__glewGenBuffers)(1,&sphere_buffer);
      GVar5 = sphere_buffer;
      (*__glewBindBuffer)(0x8892);
      regenerateSpherePositions();
      _check_gl_error((char *)0x1aa,GVar5);
      (*__glewGenBuffers)(1,&vertex_buffer);
      GVar5 = vertex_buffer;
      (*__glewBindBuffer)(0x8892);
      regenerateBuffer();
      _check_gl_error((char *)0x1af,GVar5);
      (*__glewGenBuffers)(1,&legendre_buffer);
      GVar5 = legendre_buffer;
      (*__glewBindBuffer)(0x8892);
      regenerateSHBuffer();
      _check_gl_error((char *)0x1b4,GVar5);
      (*__glewGenBuffers)(1,&index_buffer);
      GVar5 = index_buffer;
      (*__glewBindBuffer)(0x8893);
      regenerateIndices();
      _check_gl_error((char *)0x1b9,GVar5);
      glGenTextures(1,&local_34);
      (*__glewActiveTexture)(0x84c0);
      glBindTexture(0xde1,local_34);
      loadCubemap("assets/ToTheMoonRocket.jpg");
      GVar5 = (*__glewCreateShader)(0x8b31);
      iVar4 = 1;
      (*__glewShaderSource)(GVar5,1,&vertex_shader_text,0);
      (*__glewCompileShader)(GVar5);
      _check_gl_error((char *)0x1c3,iVar4);
      checkShaderError(GVar5);
      shader = (*__glewCreateShader)(0x8b30);
      iVar4 = 1;
      (*__glewShaderSource)(shader,1,&fragment_shader_text,0);
      (*__glewCompileShader)(shader);
      _check_gl_error((char *)0x1c9,iVar4);
      checkShaderError(shader);
      program = (*__glewCreateProgram)();
      (*__glewAttachShader)(program,GVar5);
      (*__glewAttachShader)(program);
      (*__glewLinkProgram)(program);
      (*__glewValidateProgram)(program);
      checkLinkError(program);
      _check_gl_error((char *)0x1d2,shader);
      local_174 = (*__glewGetUniformLocation)(program,"MVP");
      uVar6 = (*__glewGetUniformLocation)(program,"scale");
      local_178 = (*__glewGetUniformLocation)(program,"textured");
      uVar7 = (*__glewGetAttribLocation)(program,"vPos");
      iVar4 = 0x15c312;
      local_170 = program;
      uVar8 = (*__glewGetAttribLocation)(program);
      _check_gl_error((char *)0x1da,iVar4);
      glClearColor(0x3e4ccccd,0x3e4ccccd,0x3e4ccccd,0x3f800000);
      glEnable(0xb71);
      GVar5 = sphere_buffer;
      (*__glewBindBuffer)(0x8892);
      _check_gl_error((char *)0x1e2,GVar5);
      (*__glewEnableVertexAttribArray)(uVar7);
      _check_gl_error((char *)0x1e4,GVar5);
      lVar16 = local_c0;
      iVar4 = 3;
      (*__glewVertexAttribPointer)(uVar7,3,0x1406,0,0xc,0);
      _check_gl_error((char *)0x1e6,iVar4);
      local_17c = uVar8;
      (*__glewEnableVertexAttribArray)(uVar8);
      _check_gl_error((char *)0x1ea,iVar4);
      glfwGetTime();
      iVar4 = glfwWindowShouldClose(lVar16);
      while (iVar4 == 0) {
        local_118.field_0.x = 1.0;
        local_118.field_0.y = 0.0;
        local_118.field_0.z = 0.0;
        local_118.field_0.w = 0.0;
        local_108 = 0;
        uStack_104 = 0x3f800000;
        uStack_100 = 0;
        uStack_fc = 0;
        local_f8 = 0;
        uStack_f4 = 0;
        uStack_f0 = 0x3f800000;
        uStack_ec = 0;
        local_e8 = 0;
        uStack_e4 = 0;
        uStack_e0 = 0;
        vStack_dc = 1.0;
        local_78.field_0.x = 1.0;
        local_78.field_0.y = 0.0;
        local_78.field_0.z = 0.0;
        local_78.field_0.w = 0.0;
        local_68 = 0;
        uStack_64 = 0x3f800000;
        uStack_60 = 0;
        local_58 = 0;
        uStack_50 = 0x3f800000;
        uStack_4c = 0;
        local_48 = 0.0;
        uStack_44 = 0;
        uStack_40 = 0;
        uStack_3c = 0x3f800000;
        local_b8 = 1.0;
        uStack_b4 = 0;
        uStack_b0 = 0;
        uStack_ac = 0;
        local_a8 = 0;
        uStack_a4 = 0x3f800000;
        uStack_a0 = 0;
        uStack_9c = 0;
        local_98 = 0;
        uStack_94 = 0;
        uStack_90 = 0x3f800000;
        uStack_8c = 0;
        local_88 = 0;
        uStack_84 = 0;
        uStack_80 = 0;
        vStack_7c = 1.0;
        piVar13 = &local_180;
        glfwGetFramebufferSize(lVar16,piVar13,&local_168);
        _check_gl_error((char *)0x1f8,(int)piVar13);
        iVar15 = local_168;
        iVar4 = local_180;
        iVar12 = 0;
        glViewport(0,0,local_180,local_168);
        _check_gl_error((char *)0x1fc,iVar12);
        glClear(0x4100);
        _check_gl_error((char *)0x1fe,iVar12);
        dVar2 = (double)glfwGetTime();
        uVar11 = (int)((ulong)((long)rotations.
                                     super__Vector_base<Rotation,_std::allocator<Rotation>_>._M_impl
                                     .super__Vector_impl_data._M_finish -
                              (long)rotations.
                                    super__Vector_base<Rotation,_std::allocator<Rotation>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 4) - 1;
        uVar9 = 0;
        if (-1 < (int)uVar11) {
          fVar19 = (float)dVar2;
          uVar18 = (ulong)uVar11 << 4 | 4;
          uVar9 = 0;
          local_d8._0_4_ = fVar19;
          lVar16 = (ulong)uVar11 + 1;
          do {
            fVar3 = ((fVar19 - *(float *)((long)rotations.
                                                super__Vector_base<Rotation,_std::allocator<Rotation>_>
                                                ._M_impl.super__Vector_impl_data._M_start +
                                         (uVar18 - 4))) * 180.0) / 3.1415927;
            local_164.field_0.x = fVar3;
            if (fVar3 < 360.0) {
              glm::rotate<float>((tmat4x4<float> *)local_158,(tmat4x4<float> *)&local_118.field_0,
                                 (float *)&local_164,
                                 (tvec3<float> *)
                                 ((long)&(rotations.
                                          super__Vector_base<Rotation,_std::allocator<Rotation>_>.
                                          _M_impl.super__Vector_impl_data._M_start)->startTime +
                                 uVar18));
              local_118.field_0.x = (value_type)local_158._0_4_;
              local_118.field_0.y = (value_type)local_158._4_8_;
              local_118.field_0.z = SUB84(local_158._4_8_,4);
              local_118.field_0.w = (value_type)local_158._12_8_;
              local_108 = SUB84(local_158._12_8_,4);
              uStack_104 = (undefined4)local_158._20_8_;
              uStack_100 = SUB84(local_158._20_8_,4);
              uStack_fc = (undefined4)cStack_13c.field_0._0_8_;
              local_f8 = (undefined4)((ulong)cStack_13c.field_0._0_8_ >> 0x20);
              uStack_f4 = (undefined4)cStack_13c.field_0._8_8_;
              uStack_f0 = (undefined4)((ulong)cStack_13c.field_0._8_8_ >> 0x20);
              uStack_ec = (undefined4)cStack_12c.field_0._0_8_;
              local_e8 = (undefined4)((ulong)cStack_12c.field_0._0_8_ >> 0x20);
              uStack_e4 = (undefined4)cStack_12c.field_0._8_8_;
              uStack_e0 = (undefined4)((ulong)cStack_12c.field_0._8_8_ >> 0x20);
              vStack_dc = (value_type)local_11c;
              uVar9 = (int)lVar16 - 1;
              fVar19 = (float)local_d8._0_4_;
            }
            uVar18 = uVar18 - 0x10;
            lVar17 = lVar16 + -1;
            bVar1 = 0 < lVar16;
            lVar16 = lVar17;
          } while (lVar17 != 0 && bVar1);
        }
        if (0 < (int)uVar9) {
          std::vector<Rotation,_std::allocator<Rotation>_>::_M_erase
                    (&rotations,
                     (iterator)
                     rotations.super__Vector_base<Rotation,_std::allocator<Rotation>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     rotations.super__Vector_base<Rotation,_std::allocator<Rotation>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar9);
        }
        iVar12 = iVar15 / 5;
        fVar19 = (float)iVar4;
        if (0 < antiRotationFrames) {
          local_d8 = ZEXT416((uint)(float)iVar4);
          local_16c = ((float)antiRotationFrames * 360.0) / (float)theta_n;
          local_164._0_8_ = 0xbf80000000000000;
          local_164.field_0.z = 0.0;
          glm::rotate<float>((tmat4x4<float> *)local_158,(tmat4x4<float> *)&local_118.field_0,
                             &local_16c,(tvec3<float> *)&local_164.field_0);
          local_118.field_0.x = (value_type)local_158._0_4_;
          local_118.field_0.y = (value_type)local_158._4_8_;
          local_118.field_0.z = SUB84(local_158._4_8_,4);
          local_118.field_0.w = (value_type)local_158._12_8_;
          local_108 = SUB84(local_158._12_8_,4);
          uStack_104 = (undefined4)local_158._20_8_;
          uStack_100 = SUB84(local_158._20_8_,4);
          uStack_fc = (undefined4)cStack_13c.field_0._0_8_;
          local_f8 = (undefined4)((ulong)cStack_13c.field_0._0_8_ >> 0x20);
          uStack_f4 = (undefined4)cStack_13c.field_0._8_8_;
          uStack_f0 = (undefined4)((ulong)cStack_13c.field_0._8_8_ >> 0x20);
          uStack_ec = (undefined4)cStack_12c.field_0._0_8_;
          local_e8 = (undefined4)((ulong)cStack_12c.field_0._0_8_ >> 0x20);
          uStack_e4 = (undefined4)cStack_12c.field_0._8_8_;
          uStack_e0 = (undefined4)((ulong)cStack_12c.field_0._8_8_ >> 0x20);
          vStack_dc = (value_type)local_11c;
          fVar19 = (float)local_d8._0_4_;
        }
        fVar19 = fVar19 / (float)iVar15;
        local_78.field_0.x = 2.0 / (fVar19 + fVar19);
        local_48 = -(fVar19 - fVar19) / (fVar19 + fVar19);
        local_78.field_0.y = 0.0;
        local_78.field_0.z = 0.0;
        local_78.field_0.w = 0.0;
        local_68 = 0;
        uStack_64 = 0x3f800000;
        uStack_60 = 0;
        local_58 = 0;
        uStack_50 = 0x3dcccccd;
        uStack_4c = 0;
        uStack_44 = 0x80000000;
        uStack_40 = 0;
        uStack_3c = 0x3f800000;
        m1 = &local_78;
        glm::detail::operator*((tmat4x4<float> *)&m1->field_0,(tmat4x4<float> *)&local_118.field_0);
        iVar4 = (int)m1;
        local_b8 = (value_type)local_158._0_4_;
        uStack_b4 = (undefined4)local_158._4_8_;
        uStack_b0 = SUB84(local_158._4_8_,4);
        uStack_ac = (undefined4)local_158._12_8_;
        local_a8 = SUB84(local_158._12_8_,4);
        uStack_a4 = (undefined4)local_158._20_8_;
        uStack_a0 = SUB84(local_158._20_8_,4);
        uStack_9c = (undefined4)cStack_13c.field_0._0_8_;
        local_98 = (undefined4)((ulong)cStack_13c.field_0._0_8_ >> 0x20);
        uStack_94 = (undefined4)cStack_13c.field_0._8_8_;
        uStack_90 = (undefined4)((ulong)cStack_13c.field_0._8_8_ >> 0x20);
        uStack_8c = (undefined4)cStack_12c.field_0._0_8_;
        local_88 = (undefined4)((ulong)cStack_12c.field_0._0_8_ >> 0x20);
        uStack_84 = (undefined4)cStack_12c.field_0._8_8_;
        uStack_80 = (undefined4)((ulong)cStack_12c.field_0._8_8_ >> 0x20);
        vStack_7c = (value_type)local_11c;
        (*__glewUseProgram)(local_170);
        _check_gl_error((char *)0x21a,iVar4);
        uVar8 = local_174;
        (*__glewUniformMatrix4fv)(local_174,1,0,&local_b8);
        (*__glewUniform1f)(0x3f800000,uVar6);
        uVar9 = (uint)textured;
        (*__glewUniform1i)(local_178);
        _check_gl_error((char *)0x21e,uVar9);
        GVar5 = vertex_buffer;
        (*__glewBindBuffer)(0x8892);
        _check_gl_error((char *)0x222,GVar5);
        uVar7 = local_17c;
        iVar4 = 1;
        (*__glewVertexAttribPointer)(local_17c,1,0x1406,0,4,0);
        _check_gl_error((char *)0x224,iVar4);
        glDrawElements(4,(int)index_count,0x1405,0);
        local_78.field_0.x = 2.0;
        local_78.field_0.y = 0.0;
        local_78.field_0.z = 0.0;
        local_78.field_0.w = 0.0;
        local_68 = 0;
        uStack_64 = 0x40000000;
        uStack_60 = 0;
        local_58 = 0;
        uStack_50 = 0x3dcccccd;
        uStack_4c = 0;
        local_48 = -0.0;
        uStack_44 = 0x80000000;
        uStack_40 = 0;
        uStack_3c = 0x3f800000;
        glm::detail::operator*
                  ((tmat4x4<float> *)&local_78.field_0,(tmat4x4<float> *)&local_118.field_0);
        local_b8 = (value_type)local_158._0_4_;
        uStack_b4 = (undefined4)local_158._4_8_;
        uStack_b0 = SUB84(local_158._4_8_,4);
        uStack_ac = (undefined4)local_158._12_8_;
        local_a8 = SUB84(local_158._12_8_,4);
        uStack_a4 = (undefined4)local_158._20_8_;
        uStack_a0 = SUB84(local_158._20_8_,4);
        uStack_9c = (undefined4)cStack_13c.field_0._0_8_;
        local_98 = (undefined4)((ulong)cStack_13c.field_0._0_8_ >> 0x20);
        uStack_94 = (undefined4)cStack_13c.field_0._8_8_;
        uStack_90 = (undefined4)((ulong)cStack_13c.field_0._8_8_ >> 0x20);
        uStack_8c = (undefined4)cStack_12c.field_0._0_8_;
        local_88 = (undefined4)((ulong)cStack_12c.field_0._0_8_ >> 0x20);
        uStack_84 = (undefined4)cStack_12c.field_0._8_8_;
        uStack_80 = (undefined4)((ulong)cStack_12c.field_0._8_8_ >> 0x20);
        vStack_7c = (value_type)local_11c;
        iVar4 = 1;
        (*__glewUniformMatrix4fv)(uVar8,1,0,&local_b8);
        _check_gl_error((char *)0x232,iVar4);
        GVar5 = legendre_buffer;
        (*__glewBindBuffer)(0x8892);
        _check_gl_error((char *)0x235,GVar5);
        glClear(0x100);
        glViewport(0,iVar12 * 4,iVar12,iVar12);
        (*__glewUniform1f)(legendre_params[0],uVar6);
        (*__glewVertexAttribPointer)(uVar7,1,0x1406,0,4,0);
        iVar4 = (int)index_count;
        glDrawElements(4,(int)index_count,0x1405,0);
        _check_gl_error((char *)0x241,iVar4);
        local_d8._0_4_ = iVar12 * 2;
        glViewport(0,iVar12 * 2,iVar12,iVar12);
        (*__glewUniform1f)(legendre_params[1],uVar6);
        (*__glewVertexAttribPointer)(uVar7,1,0x1406,0,4,vertex_count << 2);
        iVar4 = (int)index_count;
        glDrawElements(4,(int)index_count,0x1405,0);
        _check_gl_error((char *)0x247,iVar4);
        glViewport(0,iVar12,iVar12);
        (*__glewUniform1f)(legendre_params[2],uVar6);
        (*__glewVertexAttribPointer)(uVar7,1,0x1406,0,4,vertex_count << 3);
        iVar4 = (int)index_count;
        glDrawElements(4,(int)index_count,0x1405,0);
        _check_gl_error((char *)0x24d,iVar4);
        glViewport(0,0,iVar12,iVar12);
        (*__glewUniform1f)(legendre_params[3],uVar6);
        (*__glewVertexAttribPointer)(uVar7,1,0x1406,0,4,vertex_count * 0xc);
        iVar4 = (int)index_count;
        glDrawElements(4,(int)index_count,0x1405,0);
        _check_gl_error((char *)0x253,iVar4);
        iVar15 = local_180 - iVar12;
        glViewport(iVar15,iVar12 * 4,iVar12,iVar12);
        (*__glewUniform1f)(legendre_params[4],uVar6);
        (*__glewVertexAttribPointer)(uVar7,1,0x1406,0,4,vertex_count << 4);
        iVar4 = (int)index_count;
        glDrawElements(4,(int)index_count,0x1405,0);
        _check_gl_error((char *)0x25f,iVar4);
        glViewport(iVar15,iVar12 * 3,iVar12,iVar12);
        (*__glewUniform1f)(legendre_params[5],uVar6);
        (*__glewVertexAttribPointer)(uVar7,1,0x1406,0,4,vertex_count * 0x14);
        iVar4 = (int)index_count;
        glDrawElements(4,(int)index_count,0x1405,0);
        _check_gl_error((char *)0x265,iVar4);
        glViewport(iVar15,local_d8._0_4_,iVar12,iVar12);
        (*__glewUniform1f)(legendre_params[6],uVar6);
        (*__glewVertexAttribPointer)(uVar7,1,0x1406,0,4,vertex_count * 0x18);
        iVar4 = (int)index_count;
        glDrawElements(4,(int)index_count,0x1405,0);
        _check_gl_error((char *)0x26b,iVar4);
        glViewport(iVar15,iVar12,iVar12,iVar12);
        (*__glewUniform1f)(legendre_params[7],uVar6);
        (*__glewVertexAttribPointer)(uVar7,1,0x1406,0,4,vertex_count * 0x1c);
        iVar4 = (int)index_count;
        glDrawElements(4,(int)index_count,0x1405,0);
        _check_gl_error((char *)0x271,iVar4);
        glViewport(iVar15,0,iVar12);
        (*__glewUniform1f)(legendre_params[8],uVar6);
        (*__glewVertexAttribPointer)(uVar7,1,0x1406,0,4);
        iVar4 = (int)index_count;
        glDrawElements(4,(int)index_count,0x1405,0);
        _check_gl_error((char *)0x277,iVar4);
        lVar16 = local_c0;
        glfwSwapBuffers(local_c0);
        _check_gl_error((char *)0x27d,iVar4);
        glfwPollEvents();
        _check_gl_error((char *)0x282,iVar4);
        if (0 < rotationFrames) {
          rotateParams();
          rotationFrames = rotationFrames + -1;
        }
        if (0 < antiRotationFrames) {
          antiRotationFrames = antiRotationFrames + -1;
        }
        glfwGetTime();
        iVar4 = glfwWindowShouldClose(lVar16);
      }
      return 0;
    }
    pcVar14 = "Failed to create window";
  }
  poVar10 = std::operator<<((ostream *)&std::cout,pcVar14);
  std::endl<char,std::char_traits<char>>(poVar10);
  exit(-1);
}

Assistant:

int main() {
    if (!glfwInit()) {
        cout << "Failed to init GLFW" << endl;
        exit(-1);
    }
    cout << "GLFW Successfully Started" << endl;

    glfwSetErrorCallback(glfw_error_callback);

    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 4);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 0);
#ifdef APPLE
    glfwWindowHint(GLFW_OPENGL_FORWARD_COMPAT, GL_TRUE);
    glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);
#endif
    GLFWwindow* window = glfwCreateWindow(640, 480, "Stupid SH Tricks", NULL, NULL);
    if (!window) {
        cout << "Failed to create window" << endl;
        exit(-1);
    }
    glfwSetKeyCallback(window, glfw_key_callback);

    glfwMakeContextCurrent(window);
    glewInit();

    glfwSwapInterval(1);

    GLuint vertex_shader, fragment_shader, program;
    GLuint mvp_location, vpos_location, vscale_location, scale_location, textured_location;
    GLuint cubemap;

    initPerformanceData();

    checkError();

    GLuint vao;
    glGenVertexArrays(1, &vao);
    glBindVertexArray(vao);
    checkError();

    glGenBuffers(1, &sphere_buffer);
    glBindBuffer(GL_ARRAY_BUFFER, sphere_buffer);
    regenerateSpherePositions();
    checkError();

    glGenBuffers(1, &vertex_buffer);
    glBindBuffer(GL_ARRAY_BUFFER, vertex_buffer);
    regenerateBuffer();
    checkError();

    glGenBuffers(1, &legendre_buffer);
    glBindBuffer(GL_ARRAY_BUFFER, legendre_buffer);
    regenerateSHBuffer();
    checkError();

    glGenBuffers(1, &index_buffer);
    glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, index_buffer);
    regenerateIndices();
    checkError();

    glGenTextures(1, &cubemap);
    glActiveTexture(GL_TEXTURE0);
    glBindTexture(GL_TEXTURE_2D, cubemap);
    loadCubemap("assets/ToTheMoonRocket.jpg");

    vertex_shader = glCreateShader(GL_VERTEX_SHADER);
    glShaderSource(vertex_shader, 1, &vertex_shader_text, NULL);
    glCompileShader(vertex_shader);
    checkError();
    checkShaderError(vertex_shader);

    fragment_shader = glCreateShader(GL_FRAGMENT_SHADER);
    glShaderSource(fragment_shader, 1, &fragment_shader_text, NULL);
    glCompileShader(fragment_shader);
    checkError();
    checkShaderError(fragment_shader);

    program = glCreateProgram();
    glAttachShader(program, vertex_shader);
    glAttachShader(program, fragment_shader);
    glLinkProgram(program);
    glValidateProgram(program);
    checkLinkError(program);
    checkError();


    mvp_location = glGetUniformLocation(program, "MVP");
    scale_location = glGetUniformLocation(program, "scale");
    textured_location = glGetUniformLocation(program, "textured");
    vpos_location = glGetAttribLocation(program, "vPos");
    vscale_location = glGetAttribLocation(program, "vScale");
    checkError();

    glClearColor(0.2f, 0.2f, 0.2f, 1.0f);

    glEnable(GL_DEPTH_TEST);

    // We'll always use the sphere_buffer for vPos
    glBindBuffer(GL_ARRAY_BUFFER, sphere_buffer);
    checkError();
    glEnableVertexAttribArray(vpos_location);
    checkError();
    glVertexAttribPointer(vpos_location, 3, GL_FLOAT, GL_FALSE, sizeof(vec3), 0);
    checkError();

    // We're going to use an attrib array for vScale, but it will be set up later.
    glEnableVertexAttribArray(vscale_location);
    checkError();

    // make sure performance data is clean going into main loop
    markPerformanceFrame();
    printPerformanceData();
    double lastPerfPrintTime = glfwGetTime();
    while (!glfwWindowShouldClose(window)) {
        float ratio;
        int width, height, viewportSize;
        mat4 m, p, mvp;

        {
            Perf stat("Setup frame and clear buffers");
            glfwGetFramebufferSize(window, &width, &height);
            checkError();
            ratio = width / (float) height;
            viewportSize = height / 5;
            glViewport(0, 0, width, height);
            checkError();
            glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
            checkError();

            float now = float(glfwGetTime());
            int lastValid = 0;
            for (int c = rotations.size()-1; c >= 0; c--) {
                Rotation &rot = rotations[c];
                float rotation = float((now - rot.startTime) * 180 / M_PI);
                if (rotation < 360) {
                    m = rotate(m, rotation, rot.axis);
                    lastValid = c;
                }
            }
            if (lastValid > 0) {
                rotations.erase(rotations.begin(), rotations.begin() + lastValid);
            }

            if (antiRotationFrames > 0) {
                float rotation = antiRotationFrames * 360.f / theta_n;
                m = rotate(m, rotation, vec3(0,-1,0));
            }
        }

        {
            Perf stat("Setup vertex pointers for first draw");
            p = ortho(-ratio, ratio, -1.f, 1.f, 10.f, -10.f);
            mvp = p * m;

            glUseProgram(program);
            checkError();
            glUniformMatrix4fv(mvp_location, 1, GL_FALSE, (const GLfloat *) &mvp[0, 0]);
            glUniform1f(scale_location, 1.f);
            glUniform1i(textured_location, textured);
            checkError();

            // draw the base buffer
            glBindBuffer(GL_ARRAY_BUFFER, vertex_buffer);
            checkError();
            glVertexAttribPointer(vscale_location, 1, GL_FLOAT, GL_FALSE, sizeof(float), 0);
            checkError();
        }
        {
            Perf stat("Draw base shape");
            // glDrawArrays(GL_POINTS, 0, vertex_count);
            glDrawElements(GL_TRIANGLES, index_count, GL_UNSIGNED_INT, 0);
        }

        // draw the components
        {
            Perf stat("Setup unforms and vertex arrays for components");
            p = ortho(-0.5f, 0.5f, -0.5f, 0.5f, 10.f, -10.f);
            mvp = p * m;
            glUniformMatrix4fv(mvp_location, 1, GL_FALSE, (const GLfloat *) &mvp[0, 0]);
            checkError();

            glBindBuffer(GL_ARRAY_BUFFER, legendre_buffer);
            checkError();

            glClear(GL_DEPTH_BUFFER_BIT); // always draw components on top of base shape. Depth test still necessary since triangles are unordered
        }

        {
            Perf stat("Draw left side");
            // left side
            glViewport(0, 4 * viewportSize, viewportSize, viewportSize);
            glUniform1f(scale_location, legendre_params[0]);
            glVertexAttribPointer(vscale_location, 1, GL_FLOAT, GL_FALSE, sizeof(float), (const void *) (0 * sizeof(float) * vertex_count));
            glDrawElements(GL_TRIANGLES, index_count, GL_UNSIGNED_INT, 0);
            checkError();

            glViewport(0, 2 * viewportSize, viewportSize, viewportSize);
            glUniform1f(scale_location, legendre_params[1]);
            glVertexAttribPointer(vscale_location, 1, GL_FLOAT, GL_FALSE, sizeof(float), (const void *) (1 * sizeof(float) * vertex_count));
            glDrawElements(GL_TRIANGLES, index_count, GL_UNSIGNED_INT, 0);
            checkError();

            glViewport(0, 1 * viewportSize, viewportSize, viewportSize);
            glUniform1f(scale_location, legendre_params[2]);
            glVertexAttribPointer(vscale_location, 1, GL_FLOAT, GL_FALSE, sizeof(float), (const void *) (2 * sizeof(float) * vertex_count));
            glDrawElements(GL_TRIANGLES, index_count, GL_UNSIGNED_INT, 0);
            checkError();

            glViewport(0, 0 * viewportSize, viewportSize, viewportSize);
            glUniform1f(scale_location, legendre_params[3]);
            glVertexAttribPointer(vscale_location, 1, GL_FLOAT, GL_FALSE, sizeof(float), (const void *) (3 * sizeof(float) * vertex_count));
            glDrawElements(GL_TRIANGLES, index_count, GL_UNSIGNED_INT, 0);
            checkError();
        }

        {
            Perf stat("Draw right side");
            // right side
            int right = width - viewportSize;

            glViewport(right, 4 * viewportSize, viewportSize, viewportSize);
            glUniform1f(scale_location, legendre_params[4]);
            glVertexAttribPointer(vscale_location, 1, GL_FLOAT, GL_FALSE, sizeof(float), (const void *) (4 * sizeof(float) * vertex_count));
            glDrawElements(GL_TRIANGLES, index_count, GL_UNSIGNED_INT, 0);
            checkError();

            glViewport(right, 3 * viewportSize, viewportSize, viewportSize);
            glUniform1f(scale_location, legendre_params[5]);
            glVertexAttribPointer(vscale_location, 1, GL_FLOAT, GL_FALSE, sizeof(float), (const void *) (5 * sizeof(float) * vertex_count));
            glDrawElements(GL_TRIANGLES, index_count, GL_UNSIGNED_INT, 0);
            checkError();

            glViewport(right, 2 * viewportSize, viewportSize, viewportSize);
            glUniform1f(scale_location, legendre_params[6]);
            glVertexAttribPointer(vscale_location, 1, GL_FLOAT, GL_FALSE, sizeof(float), (const void *) (6 * sizeof(float) * vertex_count));
            glDrawElements(GL_TRIANGLES, index_count, GL_UNSIGNED_INT, 0);
            checkError();

            glViewport(right, 1 * viewportSize, viewportSize, viewportSize);
            glUniform1f(scale_location, legendre_params[7]);
            glVertexAttribPointer(vscale_location, 1, GL_FLOAT, GL_FALSE, sizeof(float), (const void *) (7 * sizeof(float) * vertex_count));
            glDrawElements(GL_TRIANGLES, index_count, GL_UNSIGNED_INT, 0);
            checkError();

            glViewport(right, 0 * viewportSize, viewportSize, viewportSize);
            glUniform1f(scale_location, legendre_params[8]);
            glVertexAttribPointer(vscale_location, 1, GL_FLOAT, GL_FALSE, sizeof(float), (const void *) (8 * sizeof(float) * vertex_count));
            glDrawElements(GL_TRIANGLES, index_count, GL_UNSIGNED_INT, 0);
            checkError();
        }

        {
            Perf stat("Swap buffers");
            glfwSwapBuffers(window);
            checkError();
        }
        {
            Perf stat("Poll events");
            glfwPollEvents();
            checkError();
        }

        if (rotationFrames > 0) {
            rotateParams();
            rotationFrames--;
        }
        if (antiRotationFrames > 0) {
            antiRotationFrames--;
        }

        markPerformanceFrame();

        double now = glfwGetTime();
        if (now - lastPerfPrintTime > 10.0) {
            printPerformanceData();
            lastPerfPrintTime = now;
        }
    }

    return 0;
}